

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

int run_test_poll_bad_fdtype(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_poll_t poll_handle;
  
  iVar1 = open64(".",0);
  poll_handle.data = (void *)(long)iVar1;
  if (poll_handle.data == (void *)0xffffffffffffffff) {
    pcVar6 = "-1";
    pcVar4 = "fd";
    uVar3 = 0x287;
    eval_b_1 = -1;
    pcVar5 = "!=";
    eval_b = -1;
  }
  else {
    eval_b = 0;
    uVar3 = uv_default_loop();
    iVar2 = uv_poll_init(uVar3,&poll_handle,iVar1);
    if (iVar2 == 0) {
      pcVar5 = "!=";
      pcVar6 = "uv_poll_init(uv_default_loop(), &poll_handle, (uv_os_sock_t) handle)";
      pcVar4 = "0";
      uVar3 = 0x28a;
      eval_b_1 = 0;
    }
    else {
      iVar1 = close(iVar1);
      eval_b = (int64_t)iVar1;
      eval_b_1 = 0;
      if (eval_b == 0) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        eval_b = 0;
        uVar3 = uv_default_loop();
        iVar1 = uv_loop_close(uVar3);
        eval_b_1 = (int64_t)iVar1;
        if (eval_b_1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "==";
        pcVar6 = "uv_loop_close(uv_default_loop())";
        pcVar4 = "0";
        uVar3 = 0x28e;
      }
      else {
        pcVar5 = "==";
        pcVar6 = "0";
        pcVar4 = "close(fd)";
        uVar3 = 0x28b;
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_b,pcVar5,eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(poll_bad_fdtype) {
#if !defined(__DragonFly__) && !defined(__FreeBSD__) && !defined(__sun) && \
    !defined(_AIX) && !defined(__MVS__) && \
    !defined(__OpenBSD__) && !defined(__CYGWIN__) && !defined(__MSYS__) && \
    !defined(__NetBSD__)
  uv_poll_t poll_handle;
  uv_os_fd_t handle;
  int fd;

#if defined(_WIN32)
  fd = _open("test/fixtures/empty_file", UV_FS_O_RDONLY);
#else
  fd = open(".", UV_FS_O_RDONLY);
#endif
  ASSERT_NE(fd, -1);
  handle = uv_get_osfhandle(fd);
  /* This uses a bad cast on windows to allow passing an invalid SOCKET. */
  ASSERT_NE(0, uv_poll_init(uv_default_loop(), &poll_handle, (uv_os_sock_t) handle));
  ASSERT_OK(close(fd));
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}